

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  int iVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  bool bVar3;
  bool bVar4;
  cmValue cVar5;
  char *pcVar6;
  string *psVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  string_view arg;
  string_view arg_00;
  string mcUpper;
  string mapProp;
  string locProp;
  string locPropBase;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableConfigs;
  string config_upper;
  string local_160;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  string *local_130;
  string local_128;
  string local_108;
  string local_d8;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_78 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_130 = suffix;
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_160,desired_config);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  iVar1 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if (iVar1 == 4) {
    pcVar6 = "IMPORTED_OBJECTS";
  }
  else if (iVar1 == 7) {
    pcVar6 = "IMPORTED_LIBNAME";
  }
  else {
    pcVar6 = "IMPORTED_LOCATION";
  }
  std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,(ulong)pcVar6);
  local_160._M_string_length = (size_type)&local_160.field_2;
  local_160._M_dataplus._M_p = &DAT_00000001;
  local_160.field_2._M_local_buf[0] = 0x5f;
  local_108._M_dataplus._M_p = &DAT_00000001;
  local_108.field_2._M_allocated_capacity = local_48;
  local_108.field_2._8_8_ = local_50;
  views._M_len = 2;
  views._M_array = (iterator)&local_108;
  local_108._M_string_length = local_160._M_string_length;
  cmCatViews_abi_cxx11_(&local_128,views);
  std::__cxx11::string::operator=((string *)local_130,(string *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160._M_dataplus._M_p = &DAT_00000014;
  local_160._M_string_length = 0x6fc2c4;
  local_160.field_2._M_allocated_capacity = local_48;
  local_160.field_2._8_8_ = local_50;
  views_00._M_len = 2;
  views_00._M_array = (iterator)&local_160;
  cmCatViews_abi_cxx11_(&local_108,views_00);
  cVar5 = GetProperty(this,&local_108);
  if (cVar5.Value != (string *)0x0) {
    arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar5.Value)->_M_string_length;
    cmExpandList(arg,&local_98,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (((_Var2._M_head_impl)->IsDLLPlatform != true) ||
     ((bVar4 = true, (_Var2._M_head_impl)->TargetType != 2 &&
      (bVar3 = IsExecutableWithExports(this), !bVar3)))) {
    if (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsAIX == true) {
      bVar4 = IsExecutableWithExports(this);
    }
    else {
      bVar4 = false;
    }
  }
  bVar3 = loc->Value != (string *)0x0;
  if (((!bVar3) && (imp->Value == (string *)0x0)) &&
     (psVar7 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_98.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_98.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      if (psVar7->_M_string_length == 0) {
        cVar5 = GetProperty(this,&local_b8);
        loc->Value = (string *)cVar5;
        if (bVar4 != false) {
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"IMPORTED_IMPLIB","")
          ;
          cVar5 = GetProperty(this,&local_160);
          imp->Value = (string *)cVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
        }
        if (imp->Value != (string *)0x0 || loc->Value != (string *)0x0) {
          local_130->_M_string_length = 0;
          *(local_130->_M_dataplus)._M_p = '\0';
        }
      }
      else {
        cmsys::SystemTools::UpperCase(&local_128,psVar7);
        local_108._M_dataplus._M_p = &DAT_00000001;
        local_160.field_2._8_8_ = &local_108.field_2;
        local_108.field_2._M_local_buf[0] = 0x5f;
        local_160._M_dataplus._M_p = (pointer)local_b8._M_string_length;
        local_160._M_string_length = (size_type)local_b8._M_dataplus._M_p;
        local_160.field_2._M_allocated_capacity = 1;
        local_140 = local_128._M_string_length;
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p;
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_160;
        local_108._M_string_length = local_160.field_2._8_8_;
        cmCatViews_abi_cxx11_(&local_d8,views_01);
        cVar5 = GetProperty(this,&local_d8);
        loc->Value = (string *)cVar5;
        if (bVar4 != false) {
          local_160._M_dataplus._M_p = (pointer)0x10;
          local_160._M_string_length = 0x6fc973;
          local_160.field_2._M_allocated_capacity = local_128._M_string_length;
          local_160.field_2._8_8_ = local_128._M_dataplus._M_p;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_160;
          cmCatViews_abi_cxx11_(&local_108,views_02);
          cVar5 = GetProperty(this,&local_108);
          imp->Value = (string *)cVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
        if (imp->Value != (string *)0x0 || loc->Value != (string *)0x0) {
          local_160._M_dataplus._M_p = &DAT_00000001;
          local_160._M_string_length = (size_type)&local_160.field_2;
          local_160.field_2._M_local_buf[0] = 0x5f;
          local_108._M_dataplus._M_p = &DAT_00000001;
          local_108.field_2._M_allocated_capacity = local_128._M_string_length;
          local_108.field_2._8_8_ = local_128._M_dataplus._M_p;
          views_03._M_len = 2;
          views_03._M_array = (iterator)&local_108;
          local_108._M_string_length = local_160._M_string_length;
          cmCatViews_abi_cxx11_((string *)local_78,views_03);
          std::__cxx11::string::operator=((string *)local_130,(string *)local_78);
          if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      bVar3 = loc->Value != (string *)0x0;
    } while (((!bVar3) && (imp->Value == (string *)0x0)) &&
            (psVar7 = psVar7 + 1,
            psVar7 != local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish));
  }
  if (((bVar3) ||
      (local_98.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_98.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) || (imp->Value != (string *)0x0)) {
    if (!bVar3 && imp->Value == (string *)0x0) {
      local_160.field_2._8_8_ = (local_130->_M_dataplus)._M_p;
      local_160.field_2._M_allocated_capacity = local_130->_M_string_length;
      local_160._M_dataplus._M_p = (pointer)local_b8._M_string_length;
      local_160._M_string_length = (size_type)local_b8._M_dataplus._M_p;
      views_04._M_len = 2;
      views_04._M_array = (iterator)&local_160;
      cmCatViews_abi_cxx11_(&local_108,views_04);
      cVar5 = GetProperty(this,&local_108);
      loc->Value = (string *)cVar5;
      if (bVar4 != false) {
        local_160.field_2._8_8_ = (local_130->_M_dataplus)._M_p;
        local_160.field_2._M_allocated_capacity = local_130->_M_string_length;
        local_160._M_dataplus._M_p = (pointer)0xf;
        local_160._M_string_length = 0x6fc8cd;
        views_05._M_len = 2;
        views_05._M_array = (iterator)&local_160;
        cmCatViews_abi_cxx11_(&local_128,views_05);
        cVar5 = GetProperty(this,&local_128);
        imp->Value = (string *)cVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    if (imp->Value == (string *)0x0 && loc->Value == (string *)0x0) {
      local_130->_M_string_length = 0;
      *(local_130->_M_dataplus)._M_p = '\0';
      cVar5 = GetProperty(this,&local_b8);
      loc->Value = (string *)cVar5;
      if (bVar4 != false) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"IMPORTED_IMPLIB","");
        cVar5 = GetProperty(this,&local_160);
        imp->Value = (string *)cVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (imp->Value == (string *)0x0 && loc->Value == (string *)0x0) {
      local_78._0_8_ = (string *)0x0;
      local_78._8_8_ = (string *)0x0;
      local_78._16_8_ = 0;
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,"IMPORTED_CONFIGURATIONS","");
      cVar5 = GetProperty(this,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if (cVar5.Value != (string *)0x0) {
        arg_00._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
        arg_00._M_len = (cVar5.Value)->_M_string_length;
        cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,false);
      }
      if (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
         (local_78._0_8_ != local_78._8_8_)) {
        psVar7 = (string *)local_78._0_8_;
        do {
          local_160._M_dataplus._M_p = &DAT_00000001;
          local_160._M_string_length = (size_type)&local_160.field_2;
          local_160.field_2._M_local_buf[0] = 0x5f;
          cmsys::SystemTools::UpperCase(&local_d8,psVar7);
          local_108._M_dataplus._M_p = local_160._M_dataplus._M_p;
          local_108._M_string_length = local_160._M_string_length;
          local_108.field_2._M_allocated_capacity = local_d8._M_string_length;
          local_108.field_2._8_8_ = local_d8._M_dataplus._M_p;
          views_06._M_len = 2;
          views_06._M_array = (iterator)&local_108;
          cmCatViews_abi_cxx11_(&local_128,views_06);
          std::__cxx11::string::operator=((string *)local_130,(string *)&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_160.field_2._8_8_ = (local_130->_M_dataplus)._M_p;
          local_160.field_2._M_allocated_capacity = local_130->_M_string_length;
          local_160._M_dataplus._M_p = (pointer)local_b8._M_string_length;
          local_160._M_string_length = (size_type)local_b8._M_dataplus._M_p;
          views_07._M_len = 2;
          views_07._M_array = (iterator)&local_160;
          cmCatViews_abi_cxx11_(&local_108,views_07);
          cVar5 = GetProperty(this,&local_108);
          loc->Value = (string *)cVar5;
          if (bVar4 != false) {
            local_160.field_2._8_8_ = (local_130->_M_dataplus)._M_p;
            local_160.field_2._M_allocated_capacity = local_130->_M_string_length;
            local_160._M_dataplus._M_p = (pointer)0xf;
            local_160._M_string_length = 0x6fc8cd;
            views_08._M_len = 2;
            views_08._M_array = (iterator)&local_160;
            cmCatViews_abi_cxx11_(&local_128,views_08);
            cVar5 = GetProperty(this,&local_128);
            imp->Value = (string *)cVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        } while (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
                (psVar7 = psVar7 + 1, psVar7 != (string *)local_78._8_8_));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
    }
    bVar4 = true;
    if (imp->Value != (string *)0x0 || loc->Value != (string *)0x0) goto LAB_00286f47;
  }
  bVar4 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 7;
LAB_00286f47:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0])
                             + 1);
  }
  return bVar4;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      cmExpandList(*mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = (this->IsDLLPlatform() &&
                   (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                    this->IsExecutableWithExports())) ||
    (this->IsAIX() && this->IsExecutableWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    std::vector<std::string> availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmExpandList(*iconfigs, availableConfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}